

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  int iVar1;
  char cVar2;
  
  if (pList != (Window *)0x0) {
    do {
      iVar1 = sqlite3WalkExprList(pWalker,pList->pOrderBy);
      cVar2 = '\x01';
      if (((((iVar1 == 0) && (iVar1 = sqlite3WalkExprList(pWalker,pList->pPartition), iVar1 == 0))
           && ((pList->pFilter == (Expr *)0x0 ||
               (iVar1 = sqlite3WalkExprNN(pWalker,pList->pFilter), iVar1 == 0)))) &&
          ((pList->pStart == (Expr *)0x0 ||
           (iVar1 = sqlite3WalkExprNN(pWalker,pList->pStart), iVar1 == 0)))) &&
         ((pList->pEnd == (Expr *)0x0 ||
          (iVar1 = sqlite3WalkExprNN(pWalker,pList->pEnd), iVar1 == 0)))) {
        cVar2 = (bOneOnly != 0) * '\x02';
      }
      if (cVar2 != '\0') {
        if (cVar2 == '\x02') {
          return 0;
        }
        return 2;
      }
      pList = pList->pNextWin;
    } while (pList != (Window *)0x0);
  }
  return 0;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}